

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvq.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  ostream *poVar5;
  ulong uVar6;
  istream *input_stream;
  size_type __n;
  ulong uVar7;
  char *pcVar8;
  bool bVar9;
  int local_4dc;
  int num_order;
  allocator local_4d1;
  ulong local_4d0;
  ulong local_4c8;
  uint local_4bc;
  string local_4b8;
  Buffer buffer;
  vector<const_char_*,_std::allocator<const_char_*>_> codebook_vectors_file;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  codebook_vectors;
  vector<double,_std::allocator<double>_> input_vector;
  MultistageVectorQuantization multistage_vector_quantization;
  vector<int,_std::allocator<int>_> codebook_indices;
  vector<double,_std::allocator<double>_> tmp;
  ifstream ifs;
  uint auStack_218 [122];
  
  num_order = 0x19;
  codebook_vectors_file.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  codebook_vectors_file.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  codebook_vectors_file.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    while( true ) {
      while( true ) {
        iVar3 = ya_getopt_long(argc,argv,"l:m:s:h",(option *)0x0,(int *)0x0);
        local_4dc = 1;
        if (iVar3 != 0x6c) break;
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&tmp);
        bVar9 = sptk::ConvertStringToInteger((string *)&ifs,&num_order);
        bVar1 = num_order < 1;
        std::__cxx11::string::~string((string *)&ifs);
        if (!bVar9 || bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,
                          "The argument for the -l option must be a positive integer");
          std::__cxx11::string::string
                    ((string *)&tmp,"msvq",(allocator *)&multistage_vector_quantization);
          sptk::PrintErrorMessage((string *)&tmp,(ostringstream *)&ifs);
          goto LAB_00103a68;
        }
        num_order = num_order + -1;
      }
      if (iVar3 == 0x6d) break;
      if (iVar3 != 0x73) {
        if (iVar3 != -1) {
          if (iVar3 == 0x68) {
            local_4dc = 0;
            anon_unknown.dwarf_62e2::PrintUsage((ostream *)&std::cout);
          }
          else {
            anon_unknown.dwarf_62e2::PrintUsage((ostream *)&std::cerr);
          }
          goto LAB_00103a82;
        }
        uVar7 = (ulong)((long)codebook_vectors_file.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)codebook_vectors_file.
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3;
        if ((int)uVar7 == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,"One or more -s options are required");
          std::__cxx11::string::string
                    ((string *)&tmp,"msvq",(allocator *)&multistage_vector_quantization);
          sptk::PrintErrorMessage((string *)&tmp,(ostringstream *)&ifs);
          goto LAB_00103a68;
        }
        bVar1 = sptk::SetBinaryMode();
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,"Cannot set translation mode");
          std::__cxx11::string::string
                    ((string *)&tmp,"msvq",(allocator *)&multistage_vector_quantization);
          sptk::PrintErrorMessage((string *)&tmp,(ostringstream *)&ifs);
          goto LAB_00103a68;
        }
        __n = (long)num_order + 1;
        codebook_vectors.
        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        codebook_vectors.
        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        codebook_vectors.
        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        uVar6 = 0;
        uVar4 = 0;
        if (0 < (int)uVar7) {
          uVar4 = uVar7 & 0xffffffff;
        }
        local_4dc = 0;
        local_4d0 = uVar7;
        goto LAB_00103805;
      }
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                (&codebook_vectors_file,&ya_optarg);
    }
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&tmp);
    bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&num_order);
    bVar9 = -1 < num_order;
    std::__cxx11::string::~string((string *)&ifs);
  } while (bVar1 && bVar9);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
  poVar5 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
  std::operator<<(poVar5,"non-negative integer");
  std::__cxx11::string::string((string *)&tmp,"msvq",(allocator *)&multistage_vector_quantization);
  sptk::PrintErrorMessage((string *)&tmp,(ostringstream *)&ifs);
LAB_00103a68:
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
  goto LAB_00103a82;
LAB_00103805:
  uVar7 = local_4d0;
  if (uVar6 == uVar4) goto LAB_00103aa5;
  buffer._vptr_Buffer = (_func_int **)0x0;
  buffer.quantization_error_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.quantization_error_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c8 = uVar6;
  std::ifstream::ifstream((istream *)&ifs);
  std::ifstream::open((char *)&ifs,
                      (_Ios_Openmode)
                      codebook_vectors_file.
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_start[local_4c8]);
  local_4bc = *(uint *)((long)auStack_218 + *(long *)(_ifs + -0x18));
  if ((local_4bc & 5) == 0) {
    std::vector<double,_std::allocator<double>_>::vector
              (&tmp,__n,(allocator_type *)&multistage_vector_quantization);
    while( true ) {
      bVar1 = sptk::ReadStream<double>(false,0,0,(int)__n,&tmp,(istream *)&ifs,(int *)0x0);
      if (!bVar1) break;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&buffer,(value_type *)&tmp);
    }
    std::ifstream::close();
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&tmp);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
    poVar5 = std::operator<<((ostream *)&tmp,"Cannot open file ");
    std::operator<<(poVar5,codebook_vectors_file.
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                           super__Vector_impl_data._M_start[local_4c8]);
    std::__cxx11::string::string
              ((string *)&multistage_vector_quantization,"msvq",(allocator *)&local_4b8);
    sptk::PrintErrorMessage((string *)&multistage_vector_quantization,(ostringstream *)&tmp);
    std::__cxx11::string::~string((string *)&multistage_vector_quantization);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp);
    local_4dc = 1;
  }
  std::ifstream::~ifstream((istream *)&ifs);
  if ((local_4bc & 5) != 0) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&buffer);
    goto LAB_00103e7f;
  }
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::push_back(&codebook_vectors,(value_type *)&buffer);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&buffer);
  uVar6 = local_4c8 + 1;
  goto LAB_00103805;
LAB_00103aa5:
  if (argc - ya_optind < 2) {
    if (argc == ya_optind) {
      pcVar8 = (char *)0x0;
    }
    else {
      pcVar8 = argv[ya_optind];
    }
    input_stream = (istream *)&ifs;
    std::ifstream::ifstream(input_stream);
    if (pcVar8 == (char *)0x0) {
LAB_00103c20:
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        input_stream = (istream *)&std::cin;
      }
      sptk::MultistageVectorQuantization::MultistageVectorQuantization
                (&multistage_vector_quantization,num_order,(int)uVar7);
      buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_00111c40;
      buffer.quantization_error_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      buffer.quantization_error_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      buffer.quantization_error_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (multistage_vector_quantization.is_valid_ == false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
        std::operator<<((ostream *)&tmp,"Failed to initialize MultistageVectorQuantization");
        std::__cxx11::string::string((string *)&local_4b8,"msvq",(allocator *)&input_vector);
        sptk::PrintErrorMessage(&local_4b8,(ostringstream *)&tmp);
        std::__cxx11::string::~string((string *)&local_4b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp);
        local_4dc = 1;
      }
      else {
        std::vector<double,_std::allocator<double>_>::vector
                  (&input_vector,__n,(allocator_type *)&tmp);
        std::vector<int,_std::allocator<int>_>::vector
                  (&codebook_indices,(long)(int)uVar7,(allocator_type *)&tmp);
        do {
          bVar1 = sptk::ReadStream<double>(false,0,0,(int)__n,&input_vector,input_stream,(int *)0x0)
          ;
          if (!bVar1) {
            local_4dc = 0;
            goto LAB_00103e4e;
          }
          bVar1 = sptk::MultistageVectorQuantization::Run
                            (&multistage_vector_quantization,&input_vector,&codebook_vectors,
                             &codebook_indices,&buffer);
          if (!bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
            std::operator<<((ostream *)&tmp,"Failed to quantize vector");
            std::__cxx11::string::string((string *)&local_4b8,"msvq",&local_4d1);
            sptk::PrintErrorMessage(&local_4b8,(ostringstream *)&tmp);
            goto LAB_00103e30;
          }
          bVar1 = sptk::WriteStream<int>
                            (0,(int)local_4d0,&codebook_indices,(ostream *)&std::cout,(int *)0x0);
        } while (bVar1);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
        std::operator<<((ostream *)&tmp,"Failed to write codebook index");
        std::__cxx11::string::string((string *)&local_4b8,"msvq",&local_4d1);
        sptk::PrintErrorMessage(&local_4b8,(ostringstream *)&tmp);
LAB_00103e30:
        std::__cxx11::string::~string((string *)&local_4b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp);
        local_4dc = 1;
LAB_00103e4e:
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&codebook_indices.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&input_vector.super__Vector_base<double,_std::allocator<double>_>);
      }
      sptk::MultistageVectorQuantization::Buffer::~Buffer(&buffer);
    }
    else {
      std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar8);
      if ((*(byte *)((long)auStack_218 + *(long *)(_ifs + -0x18)) & 5) == 0) goto LAB_00103c20;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
      poVar5 = std::operator<<((ostream *)&tmp,"Cannot open file ");
      std::operator<<(poVar5,pcVar8);
      std::__cxx11::string::string
                ((string *)&multistage_vector_quantization,"msvq",(allocator *)&buffer);
      sptk::PrintErrorMessage((string *)&multistage_vector_quantization,(ostringstream *)&tmp);
      std::__cxx11::string::~string((string *)&multistage_vector_quantization);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp);
      local_4dc = 1;
    }
    std::ifstream::~ifstream(&ifs);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::operator<<((ostream *)&ifs,"Too many input files");
    std::__cxx11::string::string((string *)&tmp,"msvq",(allocator *)&multistage_vector_quantization)
    ;
    sptk::PrintErrorMessage((string *)&tmp,(ostringstream *)&ifs);
    std::__cxx11::string::~string((string *)&tmp);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
    local_4dc = 1;
  }
LAB_00103e7f:
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::~vector(&codebook_vectors);
LAB_00103a82:
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&codebook_vectors_file.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)
  ;
  return local_4dc;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  std::vector<const char*> codebook_vectors_file;

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:s:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("msvq", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("msvq", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        codebook_vectors_file.push_back(optarg);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_stage(static_cast<int>(codebook_vectors_file.size()));
  if (0 == num_stage) {
    std::ostringstream error_message;
    error_message << "One or more -s options are required";
    sptk::PrintErrorMessage("msvq", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("msvq", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<std::vector<std::vector<double> > > codebook_vectors;
  for (int n(0); n < num_stage; ++n) {
    std::vector<std::vector<double> > codebook;
    {
      std::ifstream ifs;
      ifs.open(codebook_vectors_file[n], std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << codebook_vectors_file[n];
        sptk::PrintErrorMessage("msvq", error_message);
        return 1;
      }

      std::vector<double> tmp(length);
      while (sptk::ReadStream(false, 0, 0, length, &tmp, &ifs, NULL)) {
        codebook.push_back(tmp);
      }
      ifs.close();
    }
    codebook_vectors.push_back(codebook);
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("msvq", error_message);
    return 1;
  }
  const char* input_vectors_file(0 == num_input_files ? NULL : argv[optind]);

  std::ifstream ifs;
  if (NULL != input_vectors_file) {
    ifs.open(input_vectors_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_vectors_file;
      sptk::PrintErrorMessage("msvq", error_message);
      return 1;
    }
  }
  std::istream& stream_for_input_vectors(ifs.is_open() ? ifs : std::cin);

  sptk::MultistageVectorQuantization multistage_vector_quantization(num_order,
                                                                    num_stage);
  sptk::MultistageVectorQuantization::Buffer buffer;
  if (!multistage_vector_quantization.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize MultistageVectorQuantization";
    sptk::PrintErrorMessage("msvq", error_message);
    return 1;
  }

  std::vector<double> input_vector(length);
  std::vector<int> codebook_indices(num_stage);

  while (sptk::ReadStream(false, 0, 0, length, &input_vector,
                          &stream_for_input_vectors, NULL)) {
    if (!multistage_vector_quantization.Run(input_vector, codebook_vectors,
                                            &codebook_indices, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to quantize vector";
      sptk::PrintErrorMessage("msvq", error_message);
      return 1;
    }
    if (!sptk::WriteStream(0, num_stage, codebook_indices, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write codebook index";
      sptk::PrintErrorMessage("msvq", error_message);
      return 1;
    }
  }

  return 0;
}